

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentfragment.cpp
# Opt level: O0

QTextDocumentFragment * __thiscall
QTextDocumentFragment::operator=(QTextDocumentFragment *this,QTextDocumentFragment *rhs)

{
  bool bVar1;
  long *in_RSI;
  QTextDocumentFragment *in_RDI;
  QTextDocumentFragmentPrivate *this_00;
  
  if (*in_RSI != 0) {
    QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x7e8fe4);
  }
  if (((in_RDI->d != (QTextDocumentFragmentPrivate *)0x0) &&
      (bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x7e8ffc), !bVar1)) &&
     (this_00 = in_RDI->d, this_00 != (QTextDocumentFragmentPrivate *)0x0)) {
    QTextDocumentFragmentPrivate::~QTextDocumentFragmentPrivate(this_00);
    operator_delete(this_00,0x18);
  }
  in_RDI->d = (QTextDocumentFragmentPrivate *)*in_RSI;
  return in_RDI;
}

Assistant:

QTextDocumentFragment &QTextDocumentFragment::operator=(const QTextDocumentFragment &rhs)
{
    if (rhs.d)
        rhs.d->ref.ref();
    if (d && !d->ref.deref())
        delete d;
    d = rhs.d;
    return *this;
}